

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

TargetPropertyEntry *
CreateTargetPropertyEntry
          (string *propertyValue,cmListFileBacktrace *backtrace,bool evaluateForBuildsystem)

{
  size_type *psVar1;
  pointer pcVar2;
  element_type *peVar3;
  cmLinkImplItem *pcVar4;
  undefined1 auVar5 [8];
  size_type sVar6;
  TargetPropertyEntry *pTVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  cmGeneratorExpression ge;
  undefined1 local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  cmLinkImplItem *local_68;
  undefined1 local_60 [16];
  string local_50;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_30;
  
  sVar6 = cmGeneratorExpression::Find(propertyValue);
  if (sVar6 == 0xffffffffffffffff) {
    pTVar7 = (TargetPropertyEntry *)operator_new(0x50);
    pcVar2 = (propertyValue->_M_dataplus)._M_p;
    local_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + propertyValue->_M_string_length);
    peVar3 = (backtrace->TopEntry).
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    pcVar4 = (cmLinkImplItem *)
             (backtrace->TopEntry).
             super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (pcVar4 != (cmLinkImplItem *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        psVar1 = &(pcVar4->super_cmLinkItem).String._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
        UNLOCK();
      }
      else {
        psVar1 = &(pcVar4->super_cmLinkItem).String._M_string_length;
        *(int *)psVar1 = (int)*psVar1 + 1;
      }
    }
    pTVar7->LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pTVar7->_vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryString_005d13a8;
    pTVar7[1]._vptr_TargetPropertyEntry = (_func_int **)&pTVar7[1].Backtrace;
    if (local_70._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60) {
      pTVar7[1].Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT71(local_60._1_7_,local_60[0]);
      pTVar7[1].Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._8_8_;
    }
    else {
      pTVar7[1]._vptr_TargetPropertyEntry = (_func_int **)local_70._M_pi;
      pTVar7[1].Backtrace.TopEntry.
      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT71(local_60._1_7_,local_60[0]);
    }
    pTVar7[1].LinkImplItem = local_68;
    pTVar7[2]._vptr_TargetPropertyEntry = (_func_int **)peVar3;
    pTVar7[2].LinkImplItem = pcVar4;
  }
  else {
    local_50.field_2._M_allocated_capacity =
         (size_type)
         (backtrace->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_50.field_2._8_8_ =
         (backtrace->TopEntry).
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    (backtrace->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (backtrace->TopEntry).
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)&local_50,(cmListFileBacktrace *)&local_50.field_2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.field_2._8_8_);
    }
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_78,&local_50);
    *(bool *)((long)local_78 + 0x168) = evaluateForBuildsystem;
    pTVar7 = (TargetPropertyEntry *)operator_new(0x28);
    auVar5 = local_78;
    local_78 = (undefined1  [8])0x0;
    pTVar7->LinkImplItem = &cmGeneratorTarget::TargetPropertyEntry::NoLinkImplItem;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pTVar7->Backtrace).TopEntry.
    super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pTVar7->_vptr_TargetPropertyEntry = (_func_int **)&PTR__TargetPropertyEntryGenex_005d12f0;
    pTVar7[1]._vptr_TargetPropertyEntry = (_func_int **)auVar5;
    local_30._M_t.
    super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
    .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
         (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
          )(_Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
            )0x0;
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)&local_30);
    std::
    unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
    ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                 *)local_78);
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&local_50);
  }
  return pTVar7;
}

Assistant:

cmGeneratorTarget::TargetPropertyEntry* CreateTargetPropertyEntry(
  const std::string& propertyValue,
  cmListFileBacktrace backtrace = cmListFileBacktrace(),
  bool evaluateForBuildsystem = false)
{
  if (cmGeneratorExpression::Find(propertyValue) != std::string::npos) {
    cmGeneratorExpression ge(std::move(backtrace));
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(propertyValue);
    cge->SetEvaluateForBuildsystem(evaluateForBuildsystem);
    return new TargetPropertyEntryGenex(std::move(cge));
  }

  return new TargetPropertyEntryString(propertyValue, backtrace);
}